

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator_ion.c
# Opt level: O3

MPP_RET allocator_ion_alloc(void *ctx,MppBufferInfo *info)

{
  uint uVar1;
  MPP_RET MVar2;
  char *fmt;
  uint uVar3;
  bool bVar4;
  int fd;
  size_t local_48;
  undefined8 local_40;
  RK_U32 local_38;
  undefined8 local_34;
  
  fd = -1;
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"mpp_ion","os_allocator_close Android do not accept NULL input\n",(char *)0x0);
    return MPP_ERR_NULL_PTR;
  }
  bVar4 = true;
  if (((byte)ion_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_ion","enter: ctx %p size %d\n","allocator_ion_alloc",ctx,info->size);
    bVar4 = ((byte)ion_debug & 1) == 0;
  }
  uVar1 = *(uint *)((long)ctx + 8);
  local_48 = info->size;
  local_40 = *ctx;
  local_38 = ion_heap_mask;
  local_34 = 0;
  if (!bVar4) {
    _mpp_log_l(4,"mpp_ion","enter: fd %d len %d align %d heap_mask %x flags %x","ion_alloc",
               (ulong)uVar1,local_48,local_40,(ulong)ion_heap_mask,0);
  }
  MVar2 = ion_ioctl(uVar1,-0x3fdfb700,&local_48);
  uVar1 = local_34._4_4_;
  uVar3 = 0xffffffff;
  if (MPP_NOK < MVar2) {
    uVar3 = local_34._4_4_;
  }
  if (((byte)ion_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_ion","leave: ret %d\n","ion_alloc",(ulong)(uint)MVar2);
  }
  if (MVar2 == MPP_OK) {
    MVar2 = ion_map_fd(*(int *)((long)ctx + 8),uVar1,&fd);
    if (MVar2 == MPP_OK) {
      MVar2 = MPP_OK;
      goto LAB_0017146f;
    }
    fmt = "ion_map_fd failed ret %d\n";
  }
  else {
    fmt = "ion_alloc failed ret %d\n";
  }
  _mpp_log_l(2,"mpp_ion",fmt,"allocator_ion_alloc",(ulong)(uint)MVar2);
LAB_0017146f:
  info->fd = fd;
  info->ptr = (void *)0x0;
  info->hnd = (void *)(long)(int)uVar3;
  if (((byte)ion_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_ion","leave: ret %d handle %d fd %d\n","allocator_ion_alloc",
               (ulong)(uint)MVar2,(ulong)uVar3,(ulong)(uint)fd);
  }
  return MVar2;
}

Assistant:

static MPP_RET allocator_ion_alloc(void *ctx, MppBufferInfo *info)
{
    MPP_RET ret = MPP_OK;
    int fd = -1;
    ion_user_handle_t hnd = -1;
    allocator_ctx_ion *p = NULL;

    if (NULL == ctx) {
        mpp_err("os_allocator_close Android do not accept NULL input\n");
        return MPP_ERR_NULL_PTR;
    }

    ion_dbg_func("enter: ctx %p size %d\n", ctx, info->size);

    p = (allocator_ctx_ion *)ctx;
    ret = ion_alloc(p->ion_device, info->size, p->alignment, ion_heap_mask,
                    0, &hnd);
    if (ret)
        mpp_err_f("ion_alloc failed ret %d\n", ret);
    else {
        ret = ion_map_fd(p->ion_device, hnd, &fd);
        if (ret)
            mpp_err_f("ion_map_fd failed ret %d\n", ret);
    }

    info->fd  = fd;
    info->ptr = NULL;
    info->hnd = (void *)(intptr_t)hnd;

    ion_dbg_func("leave: ret %d handle %d fd %d\n", ret, hnd, fd);
    return ret;
}